

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O0

void * raviX_ptrlist_iter_next(PtrListIterator *self)

{
  void *pvVar1;
  void *ptr;
  PtrListIterator *self_local;
  
  if (self->__head != (PtrList *)0x0) {
    self->__nr = self->__nr + 1;
    while( true ) {
      while (self->__nr < (int)(short)(char)*(undefined2 *)self->__list) {
        pvVar1 = self->__list->list_[self->__nr];
        if (*(short *)self->__list >> 8 == 0) {
          return pvVar1;
        }
        if (pvVar1 != (void *)0x0) {
          return pvVar1;
        }
        self->__nr = self->__nr + 1;
      }
      if (self->__list->next_ == self->__head) break;
      self->__list = self->__list->next_;
      self->__nr = 0;
    }
  }
  return (void *)0x0;
}

Assistant:

void *raviX_ptrlist_iter_next(PtrListIterator *self)
{
	if (self->__head == NULL)
		return NULL;
	self->__nr++;
Lretry:
	if (self->__nr < self->__list->nr_) {
		void *ptr = self->__list->list_[self->__nr];
		if (self->__list->rm_ && !ptr) {
			self->__nr++;
			goto Lretry;
		}
		return ptr;
	} else if (self->__list->next_ != self->__head) {
		self->__list = self->__list->next_;
		self->__nr = 0;
		goto Lretry;
	}
	return NULL;
}